

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  uchar uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint y_00;
  int iVar12;
  stbi_uc *data;
  byte *pbVar13;
  uchar *puVar14;
  ulong uVar15;
  uint uVar16;
  uint x_00;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uchar *puVar20;
  uchar *puVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  int iVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  iVar5 = stbi__get16be(s);
  uVar6 = stbi__get16be(s);
  if ((uVar6 | iVar5 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (stbi_uc *)0x0;
  }
  iVar5 = stbi__get16be(s);
  if (iVar5 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (stbi_uc *)0x0;
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar5 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar5 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar5);
      goto LAB_0011041c;
    }
  }
  s->img_buffer = s->img_buffer + 6;
LAB_0011041c:
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0x11) {
    iVar5 = stbi__get16be(s);
    uVar7 = stbi__get16be(s);
    iVar8 = stbi__get16be(s);
    uVar9 = stbi__get16be(s);
    iVar10 = stbi__get16be(s);
    if (iVar10 == 8) {
      iVar10 = stbi__get16be(s);
      if (iVar10 == 3) {
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        stbi__skip(s,iVar10 << 0x10 | uVar11);
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        stbi__skip(s,iVar10 << 0x10 | uVar11);
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        stbi__skip(s,iVar10 << 0x10 | uVar11);
        uVar11 = stbi__get16be(s);
        if (uVar11 < 2) {
          uVar16 = iVar5 * 0x10000;
          y_00 = uVar7 + uVar16;
          uVar19 = iVar8 * 0x10000;
          x_00 = uVar9 + uVar19;
          iVar5 = y_00 * x_00;
          data = (stbi_uc *)malloc((long)(iVar5 * 4));
          if (data == (uchar *)0x0) {
            stbi__g_failure_reason = "outofmem";
          }
          else {
            if (uVar11 == 0) {
              psVar1 = s->buffer_start;
              lVar17 = (ulong)((uVar7 | uVar16) * (uVar9 | uVar19)) - 1;
              auVar75._8_4_ = (int)lVar17;
              auVar75._0_8_ = lVar17;
              auVar75._12_4_ = (int)((ulong)lVar17 >> 0x20);
              uVar7 = (uVar7 + uVar16) * (uVar9 + uVar19);
              uVar15 = 0;
              puVar20 = data;
              auVar82 = _DAT_0011c2c0;
              auVar22 = _DAT_0011c2d0;
              auVar83 = _DAT_0011c2e0;
              auVar23 = _DAT_0011c2f0;
              auVar26 = _DAT_0011c300;
              auVar31 = _DAT_0011c310;
              auVar32 = _DAT_0011c320;
              auVar54 = _DAT_0011c330;
              do {
                if (uVar6 < uVar15) {
                  if (0 < iVar5) {
                    uVar4 = -(uVar15 == 3);
                    uVar18 = 0;
                    do {
                      auVar77._8_4_ = (int)uVar18;
                      auVar77._0_8_ = uVar18;
                      auVar77._12_4_ = (int)(uVar18 >> 0x20);
                      auVar28 = auVar75 ^ _DAT_0011c010;
                      auVar42 = (auVar77 | auVar54) ^ _DAT_0011c010;
                      iVar8 = auVar28._0_4_;
                      iVar68 = -(uint)(iVar8 < auVar42._0_4_);
                      iVar10 = auVar28._4_4_;
                      auVar43._4_4_ = -(uint)(iVar10 < auVar42._4_4_);
                      iVar12 = auVar28._8_4_;
                      iVar74 = -(uint)(iVar12 < auVar42._8_4_);
                      iVar30 = auVar28._12_4_;
                      auVar43._12_4_ = -(uint)(iVar30 < auVar42._12_4_);
                      auVar61._4_4_ = iVar68;
                      auVar61._0_4_ = iVar68;
                      auVar61._8_4_ = iVar74;
                      auVar61._12_4_ = iVar74;
                      auVar76 = pshuflw(in_XMM5,auVar61,0xe8);
                      auVar28._4_4_ = -(uint)(auVar42._4_4_ == iVar10);
                      auVar28._12_4_ = -(uint)(auVar42._12_4_ == iVar30);
                      auVar28._0_4_ = auVar28._4_4_;
                      auVar28._8_4_ = auVar28._12_4_;
                      auVar78 = pshuflw(in_XMM6,auVar28,0xe8);
                      auVar43._0_4_ = auVar43._4_4_;
                      auVar43._8_4_ = auVar43._12_4_;
                      auVar42 = pshuflw(auVar76,auVar43,0xe8);
                      auVar79._8_4_ = 0xffffffff;
                      auVar79._0_8_ = 0xffffffffffffffff;
                      auVar79._12_4_ = 0xffffffff;
                      auVar42 = (auVar42 | auVar78 & auVar76) ^ auVar79;
                      auVar42 = packssdw(auVar42,auVar42);
                      if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4] = uVar4;
                      }
                      auVar43 = auVar28 & auVar61 | auVar43;
                      auVar28 = packssdw(auVar43,auVar43);
                      auVar28 = packssdw(auVar28 ^ auVar79,auVar28 ^ auVar79);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28._0_4_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 4] = uVar4;
                      }
                      auVar28 = (auVar77 | auVar32) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar28._0_4_);
                      auVar78._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar28._8_4_);
                      auVar78._12_4_ = -(uint)(iVar30 < auVar28._12_4_);
                      auVar42._4_4_ = iVar68;
                      auVar42._0_4_ = iVar68;
                      auVar42._8_4_ = iVar74;
                      auVar42._12_4_ = iVar74;
                      auVar76._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                      auVar76._12_4_ = -(uint)(auVar28._12_4_ == iVar30);
                      auVar76._0_4_ = auVar76._4_4_;
                      auVar76._8_4_ = auVar76._12_4_;
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      auVar28 = auVar76 & auVar42 | auVar78;
                      auVar28 = packssdw(auVar28,auVar28);
                      auVar28 = packssdw(auVar28 ^ auVar79,auVar28 ^ auVar79);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
                        puVar20[uVar18 * 4 + 8] = uVar4;
                      }
                      auVar42 = pshufhw(auVar42,auVar42,0x84);
                      auVar61 = pshufhw(auVar76,auVar76,0x84);
                      auVar43 = pshufhw(auVar42,auVar78,0x84);
                      auVar42 = (auVar43 | auVar61 & auVar42) ^ auVar79;
                      auVar42 = packssdw(auVar42,auVar42);
                      auVar42 = packsswb(auVar42,auVar42);
                      if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0xc] = uVar4;
                      }
                      auVar42 = (auVar77 | auVar31) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar42._0_4_);
                      auVar45._4_4_ = -(uint)(iVar10 < auVar42._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar42._8_4_);
                      auVar45._12_4_ = -(uint)(iVar30 < auVar42._12_4_);
                      auVar62._4_4_ = iVar68;
                      auVar62._0_4_ = iVar68;
                      auVar62._8_4_ = iVar74;
                      auVar62._12_4_ = iVar74;
                      auVar28 = pshuflw(auVar28,auVar62,0xe8);
                      auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar10);
                      auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar30);
                      auVar44._0_4_ = auVar44._4_4_;
                      auVar44._8_4_ = auVar44._12_4_;
                      auVar43 = pshuflw(auVar79,auVar44,0xe8);
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar42 = pshuflw(auVar28,auVar45,0xe8);
                      auVar80._8_4_ = 0xffffffff;
                      auVar80._0_8_ = 0xffffffffffffffff;
                      auVar80._12_4_ = 0xffffffff;
                      auVar28 = (auVar42 | auVar43 & auVar28) ^ auVar80;
                      auVar28 = packssdw(auVar28,auVar28);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x10] = uVar4;
                      }
                      auVar45 = auVar44 & auVar62 | auVar45;
                      auVar28 = packssdw(auVar45,auVar45);
                      auVar28 = packssdw(auVar28 ^ auVar80,auVar28 ^ auVar80);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28._4_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x14] = uVar4;
                      }
                      auVar28 = (auVar77 | auVar26) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar28._0_4_);
                      auVar72._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar28._8_4_);
                      auVar72._12_4_ = -(uint)(iVar30 < auVar28._12_4_);
                      auVar46._4_4_ = iVar68;
                      auVar46._0_4_ = iVar68;
                      auVar46._8_4_ = iVar74;
                      auVar46._12_4_ = iVar74;
                      auVar63._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                      auVar63._12_4_ = -(uint)(auVar28._12_4_ == iVar30);
                      auVar63._0_4_ = auVar63._4_4_;
                      auVar63._8_4_ = auVar63._12_4_;
                      auVar72._0_4_ = auVar72._4_4_;
                      auVar72._8_4_ = auVar72._12_4_;
                      auVar28 = auVar63 & auVar46 | auVar72;
                      auVar28 = packssdw(auVar28,auVar28);
                      auVar28 = packssdw(auVar28 ^ auVar80,auVar28 ^ auVar80);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x18] = uVar4;
                      }
                      auVar42 = pshufhw(auVar46,auVar46,0x84);
                      auVar61 = pshufhw(auVar63,auVar63,0x84);
                      auVar43 = pshufhw(auVar42,auVar72,0x84);
                      auVar42 = (auVar43 | auVar61 & auVar42) ^ auVar80;
                      auVar42 = packssdw(auVar42,auVar42);
                      auVar42 = packsswb(auVar42,auVar42);
                      if ((auVar42._6_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x1c] = uVar4;
                      }
                      auVar42 = (auVar77 | auVar23) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar42._0_4_);
                      auVar48._4_4_ = -(uint)(iVar10 < auVar42._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar42._8_4_);
                      auVar48._12_4_ = -(uint)(iVar30 < auVar42._12_4_);
                      auVar64._4_4_ = iVar68;
                      auVar64._0_4_ = iVar68;
                      auVar64._8_4_ = iVar74;
                      auVar64._12_4_ = iVar74;
                      auVar28 = pshuflw(auVar28,auVar64,0xe8);
                      auVar47._4_4_ = -(uint)(auVar42._4_4_ == iVar10);
                      auVar47._12_4_ = -(uint)(auVar42._12_4_ == iVar30);
                      auVar47._0_4_ = auVar47._4_4_;
                      auVar47._8_4_ = auVar47._12_4_;
                      auVar43 = pshuflw(auVar80,auVar47,0xe8);
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar42 = pshuflw(auVar28,auVar48,0xe8);
                      auVar81._8_4_ = 0xffffffff;
                      auVar81._0_8_ = 0xffffffffffffffff;
                      auVar81._12_4_ = 0xffffffff;
                      auVar28 = (auVar42 | auVar43 & auVar28) ^ auVar81;
                      auVar28 = packssdw(auVar28,auVar28);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x20] = uVar4;
                      }
                      auVar48 = auVar47 & auVar64 | auVar48;
                      auVar28 = packssdw(auVar48,auVar48);
                      auVar28 = packssdw(auVar28 ^ auVar81,auVar28 ^ auVar81);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28._8_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x24] = uVar4;
                      }
                      auVar28 = (auVar77 | auVar83) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar28._0_4_);
                      auVar73._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar28._8_4_);
                      auVar73._12_4_ = -(uint)(iVar30 < auVar28._12_4_);
                      auVar49._4_4_ = iVar68;
                      auVar49._0_4_ = iVar68;
                      auVar49._8_4_ = iVar74;
                      auVar49._12_4_ = iVar74;
                      auVar65._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                      auVar65._12_4_ = -(uint)(auVar28._12_4_ == iVar30);
                      auVar65._0_4_ = auVar65._4_4_;
                      auVar65._8_4_ = auVar65._12_4_;
                      auVar73._0_4_ = auVar73._4_4_;
                      auVar73._8_4_ = auVar73._12_4_;
                      auVar28 = auVar65 & auVar49 | auVar73;
                      auVar28 = packssdw(auVar28,auVar28);
                      auVar28 = packssdw(auVar28 ^ auVar81,auVar28 ^ auVar81);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x28] = uVar4;
                      }
                      auVar42 = pshufhw(auVar49,auVar49,0x84);
                      auVar61 = pshufhw(auVar65,auVar65,0x84);
                      auVar43 = pshufhw(auVar42,auVar73,0x84);
                      auVar42 = (auVar43 | auVar61 & auVar42) ^ auVar81;
                      auVar42 = packssdw(auVar42,auVar42);
                      auVar42 = packsswb(auVar42,auVar42);
                      if ((auVar42._10_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x2c] = uVar4;
                      }
                      auVar42 = (auVar77 | auVar22) ^ _DAT_0011c010;
                      iVar68 = -(uint)(iVar8 < auVar42._0_4_);
                      auVar51._4_4_ = -(uint)(iVar10 < auVar42._4_4_);
                      iVar74 = -(uint)(iVar12 < auVar42._8_4_);
                      auVar51._12_4_ = -(uint)(iVar30 < auVar42._12_4_);
                      auVar66._4_4_ = iVar68;
                      auVar66._0_4_ = iVar68;
                      auVar66._8_4_ = iVar74;
                      auVar66._12_4_ = iVar74;
                      auVar28 = pshuflw(auVar28,auVar66,0xe8);
                      auVar50._4_4_ = -(uint)(auVar42._4_4_ == iVar10);
                      auVar50._12_4_ = -(uint)(auVar42._12_4_ == iVar30);
                      auVar50._0_4_ = auVar50._4_4_;
                      auVar50._8_4_ = auVar50._12_4_;
                      auVar43 = pshuflw(auVar81,auVar50,0xe8);
                      auVar51._0_4_ = auVar51._4_4_;
                      auVar51._8_4_ = auVar51._12_4_;
                      auVar42 = pshuflw(auVar28,auVar51,0xe8);
                      in_XMM6._8_4_ = 0xffffffff;
                      in_XMM6._0_8_ = 0xffffffffffffffff;
                      in_XMM6._12_4_ = 0xffffffff;
                      auVar28 = (auVar42 | auVar43 & auVar28) ^ in_XMM6;
                      auVar28 = packssdw(auVar28,auVar28);
                      in_XMM5 = packsswb(auVar28,auVar28);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x30] = uVar4;
                      }
                      auVar51 = auVar50 & auVar66 | auVar51;
                      auVar28 = packssdw(auVar51,auVar51);
                      auVar28 = packssdw(auVar28 ^ in_XMM6,auVar28 ^ in_XMM6);
                      auVar28 = packsswb(auVar28,auVar28);
                      if ((auVar28._12_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x34] = uVar4;
                      }
                      auVar77 = (auVar77 | auVar82) ^ _DAT_0011c010;
                      auVar67._0_4_ = -(uint)(iVar8 < auVar77._0_4_);
                      auVar67._4_4_ = -(uint)(iVar10 < auVar77._4_4_);
                      auVar67._8_4_ = -(uint)(iVar12 < auVar77._8_4_);
                      auVar67._12_4_ = -(uint)(iVar30 < auVar77._12_4_);
                      auVar52._4_4_ = auVar67._0_4_;
                      auVar52._0_4_ = auVar67._0_4_;
                      auVar52._8_4_ = auVar67._8_4_;
                      auVar52._12_4_ = auVar67._8_4_;
                      auVar25._4_4_ = -(uint)(auVar77._4_4_ == iVar10);
                      auVar25._12_4_ = -(uint)(auVar77._12_4_ == iVar30);
                      auVar25._0_4_ = auVar25._4_4_;
                      auVar25._8_4_ = auVar25._12_4_;
                      auVar29._4_4_ = auVar67._4_4_;
                      auVar29._0_4_ = auVar67._4_4_;
                      auVar29._8_4_ = auVar67._12_4_;
                      auVar29._12_4_ = auVar67._12_4_;
                      auVar77 = packssdw(auVar67,auVar25 & auVar52 | auVar29);
                      auVar77 = packssdw(auVar77 ^ in_XMM6,auVar77 ^ in_XMM6);
                      auVar77 = packsswb(auVar77,auVar77);
                      if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        puVar20[uVar18 * 4 + 0x38] = uVar4;
                      }
                      auVar42 = pshufhw(auVar52,auVar52,0x84);
                      auVar77 = pshufhw(auVar25,auVar25,0x84);
                      auVar28 = pshufhw(auVar29,auVar29,0x84);
                      auVar77 = packssdw(auVar77 & auVar42,(auVar28 | auVar77 & auVar42) ^ in_XMM6);
                      auVar77 = packsswb(auVar77,auVar77);
                      if ((auVar77._14_2_ >> 8 & 1) != 0) {
                        puVar20[uVar18 * 4 + 0x3c] = uVar4;
                      }
                      uVar18 = uVar18 + 0x10;
                    } while (((ulong)uVar7 + 0xf & 0xfffffffffffffff0) != uVar18);
                  }
                }
                else if (0 < iVar5) {
                  lVar17 = 0;
                  do {
                    puVar21 = s->img_buffer;
                    if (puVar21 < s->img_buffer_end) {
LAB_00111337:
                      s->img_buffer = puVar21 + 1;
                      uVar4 = *puVar21;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar8 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar8;
                        }
                        puVar21 = s->img_buffer;
                        auVar82 = _DAT_0011c2c0;
                        auVar22 = _DAT_0011c2d0;
                        auVar83 = _DAT_0011c2e0;
                        auVar23 = _DAT_0011c2f0;
                        auVar26 = _DAT_0011c300;
                        auVar31 = _DAT_0011c310;
                        auVar32 = _DAT_0011c320;
                        auVar54 = _DAT_0011c330;
                        goto LAB_00111337;
                      }
                      uVar4 = '\0';
                    }
                    puVar20[lVar17 * 4] = uVar4;
                    lVar17 = lVar17 + 1;
                  } while (uVar7 != (uint)lVar17);
                }
                uVar15 = uVar15 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar15 != 4);
            }
            else {
              stbi__skip(s,uVar6 * y_00 * 2);
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              lVar17 = (ulong)((uVar7 | uVar16) * (uVar9 | uVar19)) - 1;
              auVar22._8_4_ = (int)lVar17;
              auVar22._0_8_ = lVar17;
              auVar22._12_4_ = (int)((ulong)lVar17 >> 0x20);
              puVar20 = data + 0x3c;
              uVar15 = 0;
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar82 = _DAT_0011c010;
              do {
                if (uVar15 < uVar6) {
                  if (0 < iVar5) {
                    puVar21 = data + uVar15;
                    iVar8 = 0;
                    do {
                      pbVar13 = s->img_buffer;
                      if (pbVar13 < s->img_buffer_end) {
LAB_001106e2:
                        s->img_buffer = pbVar13 + 1;
                        bVar3 = *pbVar13;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar10 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar2;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar10;
                          }
                          auVar83._8_4_ = 0xffffffff;
                          auVar83._0_8_ = 0xffffffffffffffff;
                          auVar83._12_4_ = 0xffffffff;
                          pbVar13 = s->img_buffer;
                          auVar82 = _DAT_0011c010;
                          goto LAB_001106e2;
                        }
                        bVar3 = 0;
                      }
                      if (bVar3 != 0x80) {
                        if ((char)bVar3 < '\0') {
                          puVar14 = s->img_buffer;
                          if (puVar14 < s->img_buffer_end) {
LAB_00110845:
                            s->img_buffer = puVar14 + 1;
                            uVar4 = *puVar14;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar10 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar2;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar1 + iVar10;
                              }
                              puVar14 = s->img_buffer;
                              auVar83._8_4_ = 0xffffffff;
                              auVar83._0_8_ = 0xffffffffffffffff;
                              auVar83._12_4_ = 0xffffffff;
                              auVar82 = _DAT_0011c010;
                              goto LAB_00110845;
                            }
                            uVar4 = '\0';
                          }
                          iVar10 = bVar3 - 0x101;
                          do {
                            *puVar21 = uVar4;
                            puVar21 = puVar21 + 4;
                            iVar10 = iVar10 + 1;
                          } while (iVar10 != 0);
                          iVar8 = iVar8 + (0x101 - (uint)bVar3);
                        }
                        else {
                          iVar10 = bVar3 + 1;
                          do {
                            puVar14 = s->img_buffer;
                            if (puVar14 < s->img_buffer_end) {
LAB_00110790:
                              s->img_buffer = puVar14 + 1;
                              uVar4 = *puVar14;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar12 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar2;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar12;
                                }
                                auVar83._8_4_ = 0xffffffff;
                                auVar83._0_8_ = 0xffffffffffffffff;
                                auVar83._12_4_ = 0xffffffff;
                                puVar14 = s->img_buffer;
                                auVar82 = _DAT_0011c010;
                                goto LAB_00110790;
                              }
                              uVar4 = '\0';
                            }
                            *puVar21 = uVar4;
                            puVar21 = puVar21 + 4;
                            iVar10 = iVar10 + -1;
                          } while (iVar10 != 0);
                          iVar8 = iVar8 + bVar3 + 1;
                        }
                      }
                    } while (iVar8 < iVar5);
                  }
                }
                else if (0 < iVar5) {
                  uVar4 = -(uVar15 == 3);
                  uVar18 = 0;
                  do {
                    auVar23._8_4_ = (int)uVar18;
                    auVar23._0_8_ = uVar18;
                    auVar23._12_4_ = (int)(uVar18 >> 0x20);
                    auVar26 = auVar22 ^ auVar82;
                    auVar31 = (auVar23 | _DAT_0011c330) ^ auVar82;
                    iVar8 = auVar26._0_4_;
                    iVar68 = -(uint)(iVar8 < auVar31._0_4_);
                    iVar10 = auVar26._4_4_;
                    auVar32._4_4_ = -(uint)(iVar10 < auVar31._4_4_);
                    iVar12 = auVar26._8_4_;
                    iVar74 = -(uint)(iVar12 < auVar31._8_4_);
                    iVar30 = auVar26._12_4_;
                    auVar32._12_4_ = -(uint)(iVar30 < auVar31._12_4_);
                    auVar54._4_4_ = iVar68;
                    auVar54._0_4_ = iVar68;
                    auVar54._8_4_ = iVar74;
                    auVar54._12_4_ = iVar74;
                    auVar75 = pshuflw(in_XMM5,auVar54,0xe8);
                    auVar26._4_4_ = -(uint)(auVar31._4_4_ == iVar10);
                    auVar26._12_4_ = -(uint)(auVar31._12_4_ == iVar30);
                    auVar26._0_4_ = auVar26._4_4_;
                    auVar26._8_4_ = auVar26._12_4_;
                    auVar77 = pshuflw(in_XMM6,auVar26,0xe8);
                    auVar32._0_4_ = auVar32._4_4_;
                    auVar32._8_4_ = auVar32._12_4_;
                    auVar31 = pshuflw(auVar75,auVar32,0xe8);
                    auVar31 = (auVar31 | auVar77 & auVar75) ^ auVar83;
                    auVar31 = packssdw(auVar31,auVar31);
                    if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0x3c] = uVar4;
                    }
                    auVar32 = auVar26 & auVar54 | auVar32;
                    auVar26 = packssdw(auVar32,auVar32);
                    auVar26 = packssdw(auVar26 ^ auVar83,auVar26 ^ auVar83);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26._0_4_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x38] = uVar4;
                    }
                    auVar26 = (auVar23 | _DAT_0011c320) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar26._0_4_);
                    auVar69._4_4_ = -(uint)(iVar10 < auVar26._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar26._8_4_);
                    auVar69._12_4_ = -(uint)(iVar30 < auVar26._12_4_);
                    auVar31._4_4_ = iVar68;
                    auVar31._0_4_ = iVar68;
                    auVar31._8_4_ = iVar74;
                    auVar31._12_4_ = iVar74;
                    auVar53._4_4_ = -(uint)(auVar26._4_4_ == iVar10);
                    auVar53._12_4_ = -(uint)(auVar26._12_4_ == iVar30);
                    auVar53._0_4_ = auVar53._4_4_;
                    auVar53._8_4_ = auVar53._12_4_;
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar26 = auVar53 & auVar31 | auVar69;
                    auVar26 = packssdw(auVar26,auVar26);
                    auVar26 = packssdw(auVar26 ^ auVar83,auVar26 ^ auVar83);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x34] = uVar4;
                    }
                    auVar31 = pshufhw(auVar31,auVar31,0x84);
                    auVar54 = pshufhw(auVar53,auVar53,0x84);
                    auVar32 = pshufhw(auVar31,auVar69,0x84);
                    auVar31 = (auVar32 | auVar54 & auVar31) ^ auVar83;
                    auVar31 = packssdw(auVar31,auVar31);
                    auVar31 = packsswb(auVar31,auVar31);
                    if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x30] = uVar4;
                    }
                    auVar31 = (auVar23 | _DAT_0011c310) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar31._0_4_);
                    auVar34._4_4_ = -(uint)(iVar10 < auVar31._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar31._8_4_);
                    auVar34._12_4_ = -(uint)(iVar30 < auVar31._12_4_);
                    auVar55._4_4_ = iVar68;
                    auVar55._0_4_ = iVar68;
                    auVar55._8_4_ = iVar74;
                    auVar55._12_4_ = iVar74;
                    auVar26 = pshuflw(auVar26,auVar55,0xe8);
                    auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar10);
                    auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar30);
                    auVar33._0_4_ = auVar33._4_4_;
                    auVar33._8_4_ = auVar33._12_4_;
                    auVar32 = pshuflw(auVar77 & auVar75,auVar33,0xe8);
                    auVar34._0_4_ = auVar34._4_4_;
                    auVar34._8_4_ = auVar34._12_4_;
                    auVar31 = pshuflw(auVar26,auVar34,0xe8);
                    auVar31 = (auVar31 | auVar32 & auVar26) ^ auVar83;
                    auVar31 = packssdw(auVar31,auVar31);
                    auVar31 = packsswb(auVar31,auVar31);
                    if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0x2c] = uVar4;
                    }
                    auVar34 = auVar33 & auVar55 | auVar34;
                    auVar31 = packssdw(auVar34,auVar34);
                    auVar31 = packssdw(auVar31 ^ auVar83,auVar31 ^ auVar83);
                    auVar31 = packsswb(auVar31,auVar31);
                    if ((auVar31._4_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x28] = uVar4;
                    }
                    auVar31 = (auVar23 | _DAT_0011c300) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar31._0_4_);
                    auVar70._4_4_ = -(uint)(iVar10 < auVar31._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar31._8_4_);
                    auVar70._12_4_ = -(uint)(iVar30 < auVar31._12_4_);
                    auVar35._4_4_ = iVar68;
                    auVar35._0_4_ = iVar68;
                    auVar35._8_4_ = iVar74;
                    auVar35._12_4_ = iVar74;
                    auVar56._4_4_ = -(uint)(auVar31._4_4_ == iVar10);
                    auVar56._12_4_ = -(uint)(auVar31._12_4_ == iVar30);
                    auVar56._0_4_ = auVar56._4_4_;
                    auVar56._8_4_ = auVar56._12_4_;
                    auVar70._0_4_ = auVar70._4_4_;
                    auVar70._8_4_ = auVar70._12_4_;
                    auVar31 = auVar56 & auVar35 | auVar70;
                    auVar31 = packssdw(auVar31,auVar31);
                    auVar31 = packssdw(auVar31 ^ auVar83,auVar31 ^ auVar83);
                    auVar31 = packsswb(auVar31,auVar31);
                    if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0x24] = uVar4;
                    }
                    auVar54 = pshufhw(auVar35,auVar35,0x84);
                    auVar77 = pshufhw(auVar56,auVar56,0x84);
                    auVar75 = pshufhw(auVar54,auVar70,0x84);
                    auVar54 = (auVar75 | auVar77 & auVar54) ^ auVar83;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._6_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x20] = uVar4;
                    }
                    auVar54 = (auVar23 | _DAT_0011c2f0) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar54._0_4_);
                    auVar37._4_4_ = -(uint)(iVar10 < auVar54._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar54._8_4_);
                    auVar37._12_4_ = -(uint)(iVar30 < auVar54._12_4_);
                    auVar57._4_4_ = iVar68;
                    auVar57._0_4_ = iVar68;
                    auVar57._8_4_ = iVar74;
                    auVar57._12_4_ = iVar74;
                    auVar31 = pshuflw(auVar31,auVar57,0xe8);
                    auVar36._4_4_ = -(uint)(auVar54._4_4_ == iVar10);
                    auVar36._12_4_ = -(uint)(auVar54._12_4_ == iVar30);
                    auVar36._0_4_ = auVar36._4_4_;
                    auVar36._8_4_ = auVar36._12_4_;
                    auVar32 = pshuflw(auVar32 & auVar26,auVar36,0xe8);
                    auVar37._0_4_ = auVar37._4_4_;
                    auVar37._8_4_ = auVar37._12_4_;
                    auVar26 = pshuflw(auVar31,auVar37,0xe8);
                    auVar26 = (auVar26 | auVar32 & auVar31) ^ auVar83;
                    auVar26 = packssdw(auVar26,auVar26);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0x1c] = uVar4;
                    }
                    auVar37 = auVar36 & auVar57 | auVar37;
                    auVar26 = packssdw(auVar37,auVar37);
                    auVar26 = packssdw(auVar26 ^ auVar83,auVar26 ^ auVar83);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26._8_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x18] = uVar4;
                    }
                    auVar26 = (auVar23 | _DAT_0011c2e0) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar26._0_4_);
                    auVar71._4_4_ = -(uint)(iVar10 < auVar26._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar26._8_4_);
                    auVar71._12_4_ = -(uint)(iVar30 < auVar26._12_4_);
                    auVar38._4_4_ = iVar68;
                    auVar38._0_4_ = iVar68;
                    auVar38._8_4_ = iVar74;
                    auVar38._12_4_ = iVar74;
                    auVar58._4_4_ = -(uint)(auVar26._4_4_ == iVar10);
                    auVar58._12_4_ = -(uint)(auVar26._12_4_ == iVar30);
                    auVar58._0_4_ = auVar58._4_4_;
                    auVar58._8_4_ = auVar58._12_4_;
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar26 = auVar58 & auVar38 | auVar71;
                    auVar26 = packssdw(auVar26,auVar26);
                    auVar26 = packssdw(auVar26 ^ auVar83,auVar26 ^ auVar83);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0x14] = uVar4;
                    }
                    auVar54 = pshufhw(auVar38,auVar38,0x84);
                    auVar77 = pshufhw(auVar58,auVar58,0x84);
                    auVar75 = pshufhw(auVar54,auVar71,0x84);
                    auVar54 = (auVar75 | auVar77 & auVar54) ^ auVar83;
                    auVar54 = packssdw(auVar54,auVar54);
                    auVar54 = packsswb(auVar54,auVar54);
                    if ((auVar54._10_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -0x10] = uVar4;
                    }
                    auVar54 = (auVar23 | _DAT_0011c2d0) ^ auVar82;
                    iVar68 = -(uint)(iVar8 < auVar54._0_4_);
                    auVar40._4_4_ = -(uint)(iVar10 < auVar54._4_4_);
                    iVar74 = -(uint)(iVar12 < auVar54._8_4_);
                    auVar40._12_4_ = -(uint)(iVar30 < auVar54._12_4_);
                    auVar59._4_4_ = iVar68;
                    auVar59._0_4_ = iVar68;
                    auVar59._8_4_ = iVar74;
                    auVar59._12_4_ = iVar74;
                    auVar26 = pshuflw(auVar26,auVar59,0xe8);
                    auVar39._4_4_ = -(uint)(auVar54._4_4_ == iVar10);
                    auVar39._12_4_ = -(uint)(auVar54._12_4_ == iVar30);
                    auVar39._0_4_ = auVar39._4_4_;
                    auVar39._8_4_ = auVar39._12_4_;
                    in_XMM6 = pshuflw(auVar32 & auVar31,auVar39,0xe8);
                    in_XMM6 = in_XMM6 & auVar26;
                    auVar40._0_4_ = auVar40._4_4_;
                    auVar40._8_4_ = auVar40._12_4_;
                    auVar26 = pshuflw(auVar26,auVar40,0xe8);
                    auVar26 = (auVar26 | in_XMM6) ^ auVar83;
                    auVar26 = packssdw(auVar26,auVar26);
                    in_XMM5 = packsswb(auVar26,auVar26);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -0xc] = uVar4;
                    }
                    auVar40 = auVar39 & auVar59 | auVar40;
                    auVar26 = packssdw(auVar40,auVar40);
                    auVar26 = packssdw(auVar26 ^ auVar83,auVar26 ^ auVar83);
                    auVar26 = packsswb(auVar26,auVar26);
                    if ((auVar26._12_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4 + -8] = uVar4;
                    }
                    auVar23 = (auVar23 | _DAT_0011c2c0) ^ auVar82;
                    auVar60._0_4_ = -(uint)(iVar8 < auVar23._0_4_);
                    auVar60._4_4_ = -(uint)(iVar10 < auVar23._4_4_);
                    auVar60._8_4_ = -(uint)(iVar12 < auVar23._8_4_);
                    auVar60._12_4_ = -(uint)(iVar30 < auVar23._12_4_);
                    auVar41._4_4_ = auVar60._0_4_;
                    auVar41._0_4_ = auVar60._0_4_;
                    auVar41._8_4_ = auVar60._8_4_;
                    auVar41._12_4_ = auVar60._8_4_;
                    auVar24._4_4_ = -(uint)(auVar23._4_4_ == iVar10);
                    auVar24._12_4_ = -(uint)(auVar23._12_4_ == iVar30);
                    auVar24._0_4_ = auVar24._4_4_;
                    auVar24._8_4_ = auVar24._12_4_;
                    auVar27._4_4_ = auVar60._4_4_;
                    auVar27._0_4_ = auVar60._4_4_;
                    auVar27._8_4_ = auVar60._12_4_;
                    auVar27._12_4_ = auVar60._12_4_;
                    auVar23 = packssdw(auVar60,auVar24 & auVar41 | auVar27);
                    auVar23 = packssdw(auVar23 ^ auVar83,auVar23 ^ auVar83);
                    auVar23 = packsswb(auVar23,auVar23);
                    if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar20[uVar18 * 4 + -4] = uVar4;
                    }
                    auVar31 = pshufhw(auVar41,auVar41,0x84);
                    auVar23 = pshufhw(auVar24,auVar24,0x84);
                    auVar26 = pshufhw(auVar27,auVar27,0x84);
                    auVar23 = packssdw(auVar23 & auVar31,(auVar26 | auVar23 & auVar31) ^ auVar83);
                    auVar23 = packsswb(auVar23,auVar23);
                    if ((auVar23._14_2_ >> 8 & 1) != 0) {
                      puVar20[uVar18 * 4] = uVar4;
                    }
                    uVar18 = uVar18 + 0x10;
                  } while (((ulong)((uVar7 + uVar16) * (uVar9 + uVar19)) + 0xf & 0xfffffffffffffff0)
                           != uVar18);
                }
                uVar15 = uVar15 + 1;
                puVar20 = puVar20 + 1;
              } while (uVar15 != 4);
            }
            if (((req_comp & 0xfffffffbU) == 0) ||
               (data = stbi__convert_format(data,4,req_comp,x_00,y_00), data != (uchar *)0x0)) {
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   if (stbi__get16be(s) != 8)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel > channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = channel == 3 ? 255 : 0;
         } else {
            // Read the data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = stbi__get8(s);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}